

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  void *pvVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar3;
  
  lVar2 = *(long *)((long)(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                          super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + -0x18);
  pvVar1 = (void *)((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper + lVar2);
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + lVar2) = 0x8dc658;
  *(undefined8 *)(&(this->super_IfcCompositeCurve).field_0x88 + lVar2) = 0x8dc720;
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   lVar2) = 0x8dc680;
  *(undefined8 *)
   ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   lVar2) = 0x8dc6a8;
  *(undefined8 *)
   (&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
     super_IfcGeometricRepresentationItem.field_0x30 + lVar2) = 0x8dc6d0;
  *(undefined8 *)
   (&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.field_0x40 + lVar2) =
       0x8dc6f8;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->super_IfcCompositeCurve).SelfIntersect.
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar3 = *(void **)((long)pvVar1 + 0x50);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)((long)pvVar1 + 0x60) - (long)pvVar3);
  }
  operator_delete(pvVar1,0xa0);
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}